

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAligned
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  type_info *n_00;
  bool bVar1;
  AllocationPolicy *policy;
  bool local_31;
  SerialArena *local_30;
  SerialArena *arena;
  type_info *type_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  
  arena = (SerialArena *)type;
  type_local = (type_info *)n;
  n_local = (size_t)this;
  bVar1 = TaggedAllocationPolicyPtr::should_record_allocs((TaggedAllocationPolicyPtr *)(this + 8));
  local_31 = false;
  if (!bVar1) {
    local_31 = GetSerialArenaFast(this,&local_30);
  }
  n_00 = type_local;
  if (local_31 == false) {
    this_local = (ThreadSafeArena *)
                 AllocateAlignedFallback(this,(size_t)type_local,(type_info *)arena);
  }
  else {
    policy = AllocPolicy(this);
    this_local = (ThreadSafeArena *)SerialArena::AllocateAligned(local_30,(size_t)n_00,policy);
  }
  return this_local;
}

Assistant:

void* AllocateAligned(size_t n, const std::type_info* type) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                              GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, AllocPolicy());
    } else {
      return AllocateAlignedFallback(n, type);
    }
  }